

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O2

string * google::protobuf::compiler::rust::GetFullyQualifiedPath<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,Context *ctx,EnumDescriptor *desc)

{
  bool bVar1;
  FileDescriptor *in_RCX;
  string rel_path;
  string local_e8;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  size_t local_48;
  char *local_40;
  
  GetCrateRelativeQualifiedPath_abi_cxx11_
            (&local_e8,(rust *)ctx,(Context *)desc,(EnumDescriptor *)in_RCX);
  bVar1 = IsInCurrentlyGeneratingCrate(ctx,desc);
  if (bVar1) {
    local_78.piece_ = absl::lts_20240722::NullSafeStringView("crate::");
    local_a8.piece_._M_str = local_e8._M_dataplus._M_p;
    local_a8.piece_._M_len = local_e8._M_string_length;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78);
  }
  else {
    GetCrateName_abi_cxx11_(&local_c8,(rust *)ctx,*(Context **)(desc + 0x10),in_RCX);
    local_78.piece_._M_str = local_c8._M_dataplus._M_p;
    local_78.piece_._M_len = local_c8._M_string_length;
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView("::");
    local_48 = local_e8._M_string_length;
    local_40 = local_e8._M_dataplus._M_p;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_78,&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullyQualifiedPath(Context& ctx, const Desc& desc) {
  auto rel_path = GetCrateRelativeQualifiedPath(ctx, desc);
  if (IsInCurrentlyGeneratingCrate(ctx, desc)) {
    return absl::StrCat("crate::", rel_path);
  }
  return absl::StrCat(GetCrateName(ctx, *desc.file()), "::", rel_path);
}